

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O2

PyObject * libxml_xmlRelaxNGPtrWrap(xmlRelaxNGPtr ctxt)

{
  PyObject *pPVar1;
  
  if (ctxt != (xmlRelaxNGPtr)0x0) {
    pPVar1 = (PyObject *)PyCapsule_New(ctxt,"xmlRelaxNGPtr",0);
    return pPVar1;
  }
  __Py_NoneStruct = __Py_NoneStruct + 1;
  return (PyObject *)&_Py_NoneStruct;
}

Assistant:

PyObject *
libxml_xmlRelaxNGPtrWrap(xmlRelaxNGPtr ctxt)
{
    PyObject *ret;

#ifdef DEBUG
    printf("libxml_xmlRelaxNGPtrWrap: ctxt = %p\n", ctxt);
#endif
    if (ctxt == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret =
        PyCapsule_New((void *) ctxt,
                                     (char *) "xmlRelaxNGPtr", NULL);
    return (ret);
}